

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

HANDLE OpenFileMappingW(DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName)

{
  bool bVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  
  if (PAL_InitializeChakraCoreCalled) {
    pvVar2 = pthread_getspecific(CorUnix::thObjKey);
    if (pvVar2 == (void *)0x0) {
      CreateCurrentThreadData();
    }
    if (lpName == (LPCWSTR)0x0) {
      iVar4 = 0x57;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003347ee;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","OpenFileMappingW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0x34a);
      fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
      iVar4 = 0x32;
    }
    bVar1 = PAL_InitializeChakraCoreCalled;
    piVar3 = __errno_location();
    *piVar3 = iVar4;
    if ((bVar1 & 1U) != 0) {
      return (HANDLE)0x0;
    }
  }
LAB_003347ee:
  abort();
}

Assistant:

HANDLE
PALAPI
OpenFileMappingW(
         IN DWORD dwDesiredAccess,
         IN BOOL bInheritHandle,
         IN LPCWSTR lpName)
{
    HANDLE hFileMapping = NULL;
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread = NULL;
    
    PERF_ENTRY(OpenFileMappingW);
    ENTRY("OpenFileMappingW(dwDesiredAccess=%#x, bInheritHandle=%d, lpName=%p (%S)\n",
          dwDesiredAccess, bInheritHandle, lpName?lpName:W16_NULLSTRING, lpName?lpName:W16_NULLSTRING);

    pThread = InternalGetCurrentThread();

    /* validate parameters */
    if (lpName == nullptr)
    {
        ERROR("name is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
    }
    else
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    LOGEXIT("OpenFileMappingW returning %p.\n", hFileMapping);
    PERF_EXIT(OpenFileMappingW);
    return hFileMapping;
}